

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void duckdb_parquet::swap(DataPageHeaderV2 *a,DataPageHeaderV2 *b)

{
  bool bVar1;
  _DataPageHeaderV2__isset _Var2;
  int32_t iVar3;
  type tVar4;
  type tVar5;
  
  iVar3 = a->num_values;
  a->num_values = b->num_values;
  b->num_values = iVar3;
  iVar3 = a->num_nulls;
  a->num_nulls = b->num_nulls;
  b->num_nulls = iVar3;
  tVar4 = b->encoding;
  iVar3 = a->num_rows;
  tVar5 = a->encoding;
  a->num_rows = b->num_rows;
  a->encoding = tVar4;
  b->num_rows = iVar3;
  b->encoding = tVar5;
  iVar3 = a->definition_levels_byte_length;
  a->definition_levels_byte_length = b->definition_levels_byte_length;
  b->definition_levels_byte_length = iVar3;
  iVar3 = a->repetition_levels_byte_length;
  a->repetition_levels_byte_length = b->repetition_levels_byte_length;
  b->repetition_levels_byte_length = iVar3;
  bVar1 = a->is_compressed;
  a->is_compressed = b->is_compressed;
  b->is_compressed = bVar1;
  swap(&a->statistics,&b->statistics);
  _Var2 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var2;
  return;
}

Assistant:

void swap(DataPageHeaderV2 &a, DataPageHeaderV2 &b) {
  using ::std::swap;
  swap(a.num_values, b.num_values);
  swap(a.num_nulls, b.num_nulls);
  swap(a.num_rows, b.num_rows);
  swap(a.encoding, b.encoding);
  swap(a.definition_levels_byte_length, b.definition_levels_byte_length);
  swap(a.repetition_levels_byte_length, b.repetition_levels_byte_length);
  swap(a.is_compressed, b.is_compressed);
  swap(a.statistics, b.statistics);
  swap(a.__isset, b.__isset);
}